

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  float *in_RDX;
  float *in_RSI;
  char *in_RDI;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ImGuiSliderFlags max_flags;
  float max_max;
  float max_min;
  bool value_changed;
  ImGuiSliderFlags min_flags;
  float min_max;
  float min_min;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *in_stack_00000108;
  void *in_stack_00000110;
  void *in_stack_00000118;
  float in_stack_00000124;
  void *in_stack_00000128;
  ImGuiDataType in_stack_00000134;
  char *in_stack_00000138;
  ImGuiSliderFlags in_stack_00000150;
  char *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  bool local_1;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    PushID(in_stack_ffffffffffffff70);
    BeginGroup();
    CalcItemWidth();
    PushMultiItemsWidths(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    if (in_XMM1_Da < in_XMM2_Da) {
      ImMin<float>(in_XMM2_Da,*in_RDX);
    }
    local_1 = DragScalar(in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000124,
                         in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000150);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (in_XMM1_Da < in_XMM2_Da) {
      ImMax<float>(in_XMM1_Da,*in_RSI);
    }
    bVar2 = DragScalar(in_stack_00000138,in_stack_00000134,in_stack_00000128,in_stack_00000124,
                       in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000150);
    local_1 = local_1 || bVar2;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    FindRenderedTextEnd(in_RDI,(char *)0x0);
    TextEx((char *)v_current_min,(char *)v_current_max,(ImGuiTextFlags)v_speed);
    EndGroup();
    PopID();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}